

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_swap_tests.cpp
# Opt level: O0

void check_swap(json *j1,json *j2)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&> EVar1;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  json j4;
  json j3;
  undefined4 in_stack_fffffffffffffe28;
  Flags in_stack_fffffffffffffe2c;
  AssertionHandler *in_stack_fffffffffffffe30;
  StringRef *in_stack_fffffffffffffe38;
  SourceLineInfo *this;
  AssertionHandler *in_stack_fffffffffffffe40;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  SourceLineInfo *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe68;
  SourceLineInfo local_160;
  StringRef local_150;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_f0;
  SourceLineInfo local_a8;
  StringRef local_98;
  
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffe30,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffe30,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::swap
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_98 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this_00 = &local_a8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/json_swap_tests.cpp"
             ,0x15);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffe50;
  capturedExpression.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (SourceLineInfo *)in_stack_fffffffffffffe30,capturedExpression,
             in_stack_fffffffffffffe2c);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xbd2182);
  local_f0 = EVar1.m_lhs;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffe30,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0xbd21d9);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe30);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe30);
  local_150 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffe30,
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this = &local_160;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/json_swap_tests.cpp"
             ,0x16);
  Catch::StringRef::StringRef((StringRef *)EVar1.m_lhs,(char *)this);
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffe50;
  capturedExpression_00.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)EVar1.m_lhs,(StringRef *)this,
             (SourceLineInfo *)in_stack_fffffffffffffe30,capturedExpression_00,
             in_stack_fffffffffffffe2c);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xbd2317);
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)EVar1.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0xbd235f);
  Catch::AssertionHandler::complete((AssertionHandler *)EVar1.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)EVar1.m_lhs);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xbd242d);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xbd243a);
  return;
}

Assistant:

void check_swap(const json& j1, const json& j2)
{
    json j3 = j1;
    json j4 = j2;

    j3.swap(j4);
    CHECK(j1 == j4);
    CHECK(j2 == j3);
}